

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O2

void PatchOptimizeMaps::remove_useless_map_variants(World *world)

{
  Map *pMVar1;
  _Base_ptr p_Var2;
  pointer puVar3;
  initializer_list<unsigned_short> __l;
  allocator_type local_59;
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_REMOVE_VARIANTS_FROM;
  unsigned_short local_40 [8];
  
  local_40[0] = 0xe0;
  local_40[1] = 0x33;
  local_40[2] = 0x3b;
  local_40[3] = 0x37;
  local_40[4] = 0x4e;
  local_40[5] = 0x294;
  local_40[6] = 0x5e;
  __l._M_len = 7;
  __l._M_array = local_40;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&MAPS_TO_REMOVE_VARIANTS_FROM,__l,&local_59);
  pMVar1 = World::map(world,0x294);
  pMVar1->_map_setup_addr = 0xffffffff;
  for (puVar3 = MAPS_TO_REMOVE_VARIANTS_FROM.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 != MAPS_TO_REMOVE_VARIANTS_FROM.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    pMVar1 = World::map(world,*puVar3);
    for (p_Var2 = (pMVar1->_variants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pMVar1->_variants)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      Map::clear(*(Map **)(p_Var2 + 1));
    }
    std::
    _Rb_tree<Map_*,_std::pair<Map_*const,_Flag>,_std::_Select1st<std::pair<Map_*const,_Flag>_>,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
    ::clear(&(pMVar1->_variants)._M_t);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&MAPS_TO_REMOVE_VARIANTS_FROM.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

static void remove_useless_map_variants(World& world)
    {
        // Clear unreachable variants and prevent them from triggering
        const std::vector<uint16_t> MAPS_TO_REMOVE_VARIANTS_FROM = {
                MAP_THIEVES_HIDEOUT_TREASURE_ROOM,
                MAP_MERCATOR_CASTLE_THRONE_ROOM,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_ARMORY_0F,
                MAP_MERCATOR_DOCKS_SUPPLY_SHOP,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        world.map(MAP_MERCATOR_DOCKS_SUPPLY_SHOP)->map_setup_addr(0xFFFFFFFF);

        for(uint16_t map_id : MAPS_TO_REMOVE_VARIANTS_FROM)
        {
            Map* map = world.map(map_id);
            for(auto& [variant_map, flag] : map->variants())
                variant_map->clear();
            map->variants().clear();
        }
    }